

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O0

ma_spatializer_config *
ma_spatializer_config_init
          (ma_spatializer_config *__return_storage_ptr__,ma_uint32 channelsIn,ma_uint32 channelsOut)

{
  ma_uint32 channelsOut_local;
  ma_uint32 channelsIn_local;
  
  memset(__return_storage_ptr__,0,0x48);
  __return_storage_ptr__->channelsIn = channelsIn;
  __return_storage_ptr__->channelsOut = channelsOut;
  __return_storage_ptr__->pChannelMapIn = (ma_channel *)0x0;
  __return_storage_ptr__->attenuationModel = ma_attenuation_model_inverse;
  __return_storage_ptr__->positioning = ma_positioning_absolute;
  __return_storage_ptr__->handedness = ma_handedness_right;
  __return_storage_ptr__->minGain = 0.0;
  __return_storage_ptr__->maxGain = 1.0;
  __return_storage_ptr__->minDistance = 1.0;
  __return_storage_ptr__->maxDistance = 3.4028235e+38;
  __return_storage_ptr__->rolloff = 1.0;
  __return_storage_ptr__->coneInnerAngleInRadians = 6.283185;
  __return_storage_ptr__->coneOuterAngleInRadians = 6.283185;
  __return_storage_ptr__->coneOuterGain = 0.0;
  __return_storage_ptr__->dopplerFactor = 1.0;
  __return_storage_ptr__->directionalAttenuationFactor = 1.0;
  __return_storage_ptr__->gainSmoothTimeInFrames = 0x168;
  return __return_storage_ptr__;
}

Assistant:

MA_API ma_spatializer_config ma_spatializer_config_init(ma_uint32 channelsIn, ma_uint32 channelsOut)
{
    ma_spatializer_config config;

    MA_ZERO_OBJECT(&config);
    config.channelsIn                   = channelsIn;
    config.channelsOut                  = channelsOut;
    config.pChannelMapIn                = NULL;
    config.attenuationModel             = ma_attenuation_model_inverse;
    config.positioning                  = ma_positioning_absolute;
    config.handedness                   = ma_handedness_right;
    config.minGain                      = 0;
    config.maxGain                      = 1;
    config.minDistance                  = 1;
    config.maxDistance                  = MA_FLT_MAX;
    config.rolloff                      = 1;
    config.coneInnerAngleInRadians      = 6.283185f; /* 360 degrees. */
    config.coneOuterAngleInRadians      = 6.283185f; /* 360 degress. */
    config.coneOuterGain                = 0.0f;
    config.dopplerFactor                = 1;
    config.directionalAttenuationFactor = 1;
    config.gainSmoothTimeInFrames       = 360;       /* 7.5ms @ 48K. */

    return config;
}